

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

qsizetype qt_accAmpIndex(QString *text)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype fa;
  undefined4 in_stack_ffffffffffffffb8;
  CaseSensitivity in_stack_ffffffffffffffbc;
  QChar *in_stack_ffffffffffffffc0;
  QString *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffe8;
  QChar local_e;
  char16_t local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x7dce51);
  if (bVar1) {
    qVar2 = -1;
  }
  else {
    do {
      do {
        QChar::QChar<char16_t,_true>(&local_a,L'&');
        qVar2 = QString::indexOf(in_stack_ffffffffffffffc8,
                                 (QChar)(char16_t)((ulong)in_stack_ffffffffffffffe8 >> 0x30),
                                 (qsizetype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        if (qVar2 == -1) {
          qVar2 = -1;
          goto LAB_007dcf47;
        }
        in_stack_ffffffffffffffc8 = (QString *)(qVar2 + 1);
        qVar3 = QString::size(in_RDI);
      } while (qVar3 <= (long)in_stack_ffffffffffffffc8);
      local_c = (char16_t)
                QString::at(in_stack_ffffffffffffffc8,(qsizetype)in_stack_ffffffffffffffc0);
      QChar::QChar<char16_t,_true>(&local_e,L'&');
      bVar1 = operator==(in_stack_ffffffffffffffc0,
                         (QChar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    } while (bVar1);
  }
LAB_007dcf47:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return qVar2;
}

Assistant:

static qsizetype qt_accAmpIndex(const QString &text)
{
#ifndef QT_NO_SHORTCUT
    if (text.isEmpty())
        return -1;

    qsizetype fa = 0;
    while ((fa = text.indexOf(u'&', fa)) != -1) {
        ++fa;
        if (fa < text.size()) {
            // ignore "&&"
            if (text.at(fa) == u'&') {

                ++fa;
                continue;
            } else {
                return fa - 1;
                break;
            }
        }
    }

    return -1;
#else
    Q_UNUSED(text);
    return -1;
#endif
}